

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

void ompt_post_init(void)

{
  ompt_initialize_t p_Var1;
  ompt_callback_thread_begin_t p_Var2;
  int iVar3;
  kmp_info_t *thread;
  ompt_data_t *poVar4;
  int *in_stack_00000038;
  ompt_data_t **in_stack_00000040;
  ompt_frame_t **in_stack_00000048;
  ompt_data_t **in_stack_00000050;
  int *in_stack_00000058;
  int in_stack_00000060;
  ompt_data_t *parallel_data;
  ompt_frame_t *task_frame;
  ompt_data_t *task_data;
  kmp_info_t *root_thread;
  
  if ((ompt_post_init::ompt_post_initialized == 0) &&
     (ompt_post_init::ompt_post_initialized = 1,
     ompt_start_tool_result != (ompt_start_tool_result_t *)0x0)) {
    p_Var1 = ompt_start_tool_result->initialize;
    iVar3 = omp_get_initial_device();
    iVar3 = (*p_Var1)(ompt_fn_lookup,iVar3,&ompt_start_tool_result->tool_data);
    ompt_enabled = (ompt_callbacks_active_t)
                   ((ulong)ompt_enabled & 0xfffffffffffffffe | (ulong)(iVar3 != 0));
    if ((ulong)(iVar3 != 0) == 0) {
      memset(&ompt_enabled,0,8);
    }
    else {
      thread = ompt_get_thread();
      ompt_set_thread_state(thread,ompt_state_overhead);
      p_Var2 = ompt_callbacks.ompt_callback_thread_begin_callback;
      if (((ulong)ompt_enabled >> 1 & 1) != 0) {
        poVar4 = __ompt_get_thread_data_internal();
        (*p_Var2)(ompt_thread_initial,poVar4);
      }
      __ompt_get_task_info_internal
                (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                 in_stack_00000040,in_stack_00000038);
      if (((ulong)ompt_enabled >> 7 & 1) != 0) {
        uRam0000000000000010 = 0x20;
        _GOMP_3_0 = &root_thread;
        (*ompt_callbacks.ompt_callback_implicit_task_callback)
                  (ompt_scope_begin,(ompt_data_t *)0x0,(ompt_data_t *)0x0,1,1,1);
        _GOMP_3_0 = (kmp_info_t **)0x0;
        uRam0000000000000010 = 0;
      }
      ompt_set_thread_state(thread,ompt_state_work_serial);
    }
  }
  return;
}

Assistant:

void ompt_post_init() {
  //--------------------------------------------------
  // Execute the post-initialization logic only once.
  //--------------------------------------------------
  static int ompt_post_initialized = 0;

  if (ompt_post_initialized)
    return;

  ompt_post_initialized = 1;

  //--------------------------------------------------
  // Initialize the tool if so indicated.
  //--------------------------------------------------
  if (ompt_start_tool_result) {
    ompt_enabled.enabled = !!ompt_start_tool_result->initialize(
        ompt_fn_lookup, omp_get_initial_device(), &(ompt_start_tool_result->tool_data));

    if (!ompt_enabled.enabled) {
      // tool not enabled, zero out the bitmap, and done
      memset(&ompt_enabled, 0, sizeof(ompt_enabled));
      return;
    }

    kmp_info_t *root_thread = ompt_get_thread();

    ompt_set_thread_state(root_thread, ompt_state_overhead);

    if (ompt_enabled.ompt_callback_thread_begin) {
      ompt_callbacks.ompt_callback(ompt_callback_thread_begin)(
          ompt_thread_initial, __ompt_get_thread_data_internal());
    }
    ompt_data_t *task_data = nullptr;
    ompt_frame_t *task_frame = nullptr;
    ompt_data_t *parallel_data = nullptr;
    __ompt_get_task_info_internal(0, NULL, &task_data, &task_frame, 
				  &parallel_data, NULL);
    if (ompt_enabled.ompt_callback_implicit_task) {
      OMPT_FRAME_SET(task_frame, exit, OMPT_GET_FRAME_ADDRESS(0),
		     (ompt_frame_runtime | OMPT_FRAME_POSITION_DEFAULT));   
      ompt_callbacks.ompt_callback(ompt_callback_implicit_task)(
        ompt_scope_begin, parallel_data /*parallel data*/, 
	task_data, 1 /*team size*/, 1 /*initial task: index=1*/, 
	ompt_task_initial);
      OMPT_FRAME_CLEAR(task_frame, exit);
    }

    ompt_set_thread_state(root_thread, ompt_state_work_serial);
  }
}